

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picnic3_tree.c
# Opt level: O2

uint * getRevealedMerkleNodes
                 (tree_t *tree,uint16_t *missingLeaves,size_t missingLeavesSize,size_t *outputSize)

{
  ulong *puVar1;
  _Bool _Var2;
  size_t i;
  void *__ptr;
  size_t sVar3;
  bitset_word_t bVar4;
  uint *list;
  uint uVar5;
  ulong uVar6;
  uint uVar7;
  ulong uVar8;
  uint uVar9;
  uint uVar10;
  int iVar11;
  
  if (missingLeaves != (uint16_t *)0x0 || missingLeavesSize == 0) {
    uVar7 = tree->numNodes;
    uVar10 = tree->numLeaves;
    __ptr = calloc((ulong)uVar7 + 0x3f >> 6,8);
    if (__ptr != (void *)0x0) {
      iVar11 = uVar7 - uVar10;
      for (sVar3 = 0; missingLeavesSize != sVar3; sVar3 = sVar3 + 1) {
        uVar5 = (uint)missingLeaves[sVar3] + iVar11;
        puVar1 = (ulong *)((long)__ptr + (ulong)(uVar5 >> 6) * 8);
        *puVar1 = *puVar1 | 1L << ((ulong)uVar5 & 0x3f);
      }
      uVar5 = uVar7 & 0xfffffffe;
      for (uVar8 = (ulong)((uVar7 >> 1) - 1); (uint)uVar8 != 0; uVar8 = uVar8 - 1) {
        bVar4 = exists(tree,(uint)uVar8);
        if (bVar4 != 0) {
          bVar4 = exists(tree,uVar5);
          uVar6 = 1L << ((ulong)(uVar5 - 1) & 0x3f) &
                  *(ulong *)((long)__ptr + (ulong)(uVar5 - 1 >> 6) * 8);
          if (bVar4 != 0) {
            if (uVar6 == 0) goto LAB_0011e863;
            uVar6 = *(ulong *)((long)__ptr + (ulong)(uVar5 >> 6) * 8) >> (ulong)(uVar5 & 0x3e) & 1;
          }
          if (uVar6 != 0) {
            puVar1 = (ulong *)((long)__ptr + (uVar8 >> 6) * 8);
            *puVar1 = *puVar1 | 1L << (uVar8 & 0x3f);
          }
        }
LAB_0011e863:
        uVar5 = uVar5 - 2;
      }
      list = (uint *)malloc((ulong)uVar10 << 2);
      if (list != (uint *)0x0) {
        uVar7 = 0;
        uVar10 = 0;
        do {
          uVar8 = (ulong)uVar7;
          if (missingLeavesSize <= uVar10) {
            free(__ptr);
            *outputSize = uVar8;
            return list;
          }
          uVar5 = (uint)missingLeaves[uVar10] + iVar11;
          do {
            uVar9 = (uVar5 + 1 >> 1) - 1;
            if ((*(ulong *)((long)__ptr + (ulong)(uVar9 >> 6) * 8) >> ((ulong)uVar9 & 0x3f) & 1) ==
                0) {
              _Var2 = contains(list,uVar8,uVar5);
              if (!_Var2) {
                list[uVar8] = uVar5;
                uVar7 = uVar7 + 1;
              }
              break;
            }
            uVar5 = uVar9;
          } while (uVar9 != 0);
          uVar10 = uVar10 + 1;
        } while( true );
      }
      free(__ptr);
    }
  }
  return (uint *)0x0;
}

Assistant:

static unsigned int* getRevealedMerkleNodes(const tree_t* tree, uint16_t* missingLeaves,
                                            size_t missingLeavesSize, size_t* outputSize) {
  if (!missingLeaves && missingLeavesSize) {
    return NULL;
  }

  const unsigned int firstLeaf = tree->numNodes - tree->numLeaves;
  bitset_word_t* missingNodes =
      calloc((tree->numNodes + sizeof(bitset_word_t) * 8 - 1) / (sizeof(bitset_word_t) * 8),
             sizeof(bitset_word_t));
  if (!missingNodes) {
    return NULL;
  }

  /* Mark leaves that are missing */
  for (size_t i = 0; i < missingLeavesSize; i++) {
    set_bit(missingNodes, firstLeaf + missingLeaves[i]);
  }

  /* For the nonleaf nodes, if both leaves are missing, mark it as missing too */
  for (unsigned int i = getParent(tree->numNodes - 1); i > 0; i--) {
    if (!exists(tree, i)) {
      continue;
    }
    if (exists(tree, 2 * i + 2)) {
      if (get_bit(missingNodes, 2 * i + 1) && get_bit(missingNodes, 2 * i + 2)) {
        set_bit(missingNodes, i);
      }
    } else {
      if (get_bit(missingNodes, 2 * i + 1)) {
        set_bit(missingNodes, i);
      }
    }
  }

  /* For each missing leaf node, add the highest missing node on the path
   * back to the root to the set to be revealed */
  unsigned int* revealed = malloc(tree->numLeaves * sizeof(unsigned int));
  if (!revealed) {
    free(missingNodes);
    return NULL;
  }

  unsigned int pos = 0;
  for (unsigned int i = 0; i < missingLeavesSize; i++) {
    /* input is leaf indexes, translate to nodes */
    unsigned int node = missingLeaves[i] + firstLeaf;
    do {
      if (!get_bit(missingNodes, getParent(node))) {
        if (!contains(revealed, pos, node)) {
          revealed[pos] = node;
          pos++;
        }
        break;
      }
    } while ((node = getParent(node)) != 0);
  }

  free(missingNodes);
  *outputSize = pos;
  return revealed;
}